

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O0

void __thiscall CriticalSection::CriticalSection(CriticalSection *this,LockNode *lock)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1af814);
  return;
}

Assistant:

CriticalSection::CriticalSection(LockNode *lock) : lock_(lock) {}